

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_util.cpp
# Opt level: O0

bool cfd::core::RandomNumberUtil::GetRandomBool(vector<bool,_std::allocator<bool>_> *random_cache)

{
  bool bVar1;
  int iVar2;
  result_type rVar3;
  CfdException *this;
  result_type_conflict rVar4;
  reference local_60;
  byte local_4e;
  undefined1 local_4d;
  int local_4c;
  bool ret;
  uint uStack_48;
  bool value;
  int i;
  uint32_t random;
  vector<bool,_std::allocator<bool>_> *local_10;
  vector<bool,_std::allocator<bool>_> *random_cache_local;
  
  local_10 = random_cache;
  if ((GetRandomBool(std::vector<bool,std::allocator<bool>>*)::rd == '\0') &&
     (iVar2 = __cxa_guard_acquire(&GetRandomBool(std::vector<bool,std::allocator<bool>>*)::rd),
     iVar2 != 0)) {
    std::random_device::random_device(&GetRandomBool::rd);
    __cxa_atexit(std::random_device::~random_device,0x3fff00,&__dso_handle);
    __cxa_guard_release(&GetRandomBool(std::vector<bool,std::allocator<bool>>*)::rd);
  }
  if ((GetRandomBool(std::vector<bool,std::allocator<bool>>*)::engine == '\0') &&
     (iVar2 = __cxa_guard_acquire(&GetRandomBool(std::vector<bool,std::allocator<bool>>*)::engine),
     iVar2 != 0)) {
    rVar3 = std::random_device::operator()(&GetRandomBool::rd);
    std::
    mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
    ::mersenne_twister_engine(&GetRandomBool::engine,(ulong)rVar3);
    __cxa_guard_release(&GetRandomBool(std::vector<bool,std::allocator<bool>>*)::engine);
  }
  if (local_10 != (vector<bool,_std::allocator<bool>_> *)0x0) {
    bVar1 = std::vector<bool,_std::allocator<bool>_>::empty(local_10);
    if (bVar1) {
      rVar4 = std::
              mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              ::operator()(&GetRandomBool::engine);
      uStack_48 = (uint)rVar4;
      for (local_4c = 0; local_4c < 0x20; local_4c = local_4c + 1) {
        local_4d = (uStack_48 >> ((byte)local_4c & 0x1f) & 1) != 0;
        std::vector<bool,_std::allocator<bool>_>::push_back(local_10,(bool)local_4d);
      }
    }
    local_60 = std::vector<bool,_std::allocator<bool>_>::back(local_10);
    local_4e = ::std::_Bit_reference::operator_cast_to_bool((_Bit_reference *)&local_60);
    std::vector<bool,_std::allocator<bool>_>::pop_back(local_10);
    return (bool)(local_4e & 1);
  }
  i._2_1_ = 1;
  this = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string
            ((string *)&random,"GetRandomBool error.",(allocator *)((long)&i + 3));
  CfdException::CfdException(this,kCfdIllegalArgumentError,(string *)&random);
  i._2_1_ = 0;
  __cxa_throw(this,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

bool RandomNumberUtil::GetRandomBool(std::vector<bool> *random_cache) {
#if defined(_WIN32) && defined(__GNUC__) && (__GNUC__ < 9)
  // for mingw gcc lower 9
  static std::mt19937 engine(static_cast<unsigned int>(time(nullptr)));
#else
  static std::random_device rd;
  static std::mt19937 engine(rd());
#endif
  if (random_cache == nullptr) {
    throw CfdException(kCfdIllegalArgumentError, "GetRandomBool error.");
  }

  if (random_cache->empty()) {
    uint32_t random = engine();
    for (int i = 0; i < 32; i++) {
      bool value = (random >> i) & 1;
      random_cache->push_back(value);
    }
  }
  bool ret = random_cache->back();
  random_cache->pop_back();
  return ret;
}